

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kss_Emu.cpp
# Opt level: O3

blargg_err_t __thiscall Kss_Emu::run_clocks(Kss_Emu *this,blip_time_t *duration,int param_2)

{
  cpu_time_t end_time;
  state_t *psVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  
  psVar1 = (this->super_Kss_Cpu).state;
  iVar3 = psVar1->base + psVar1->time;
  iVar4 = *duration;
  if (iVar3 < iVar4) {
    do {
      end_time = this->next_play;
      if (iVar4 < this->next_play) {
        end_time = iVar4;
      }
      Kss_Cpu::run(&this->super_Kss_Cpu,end_time);
      psVar1 = (this->super_Kss_Cpu).state;
      if ((this->super_Kss_Cpu).r.pc == 0xffff) {
        iVar3 = end_time - psVar1->base;
        psVar1->time = iVar3;
        if (this->next_play <= end_time) {
          this->next_play = this->next_play + this->play_period;
          if ((this->gain_updated == false) &&
             (this->gain_updated = true, this->scc_accessed == true)) {
            update_gain(this);
            psVar1 = (this->super_Kss_Cpu).state;
          }
          uVar2 = (this->super_Kss_Cpu).r.sp;
          this->ram[uVar2 - 1 & 0xffff] = 0xff;
          uVar2 = uVar2 - 2;
          (this->super_Kss_Cpu).r.sp = uVar2;
          this->ram[uVar2] = 0xff;
          (this->super_Kss_Cpu).r.pc = *(uint16_t *)(this->header_).super_header_t.play_addr;
          iVar3 = psVar1->time;
        }
      }
      else {
        iVar3 = psVar1->time;
        if (this->next_play <= psVar1->base + iVar3) {
          this->next_play = this->next_play + this->play_period;
        }
      }
      iVar3 = iVar3 + psVar1->base;
      iVar4 = *duration;
    } while (iVar3 < iVar4);
  }
  *duration = iVar3;
  this->next_play = this->next_play - iVar3;
  psVar1->time = psVar1->time - *duration;
  iVar4 = *duration;
  iVar3 = (this->ay).last_time;
  if (iVar3 < iVar4) {
    Ay_Apu::run_until(&this->ay,iVar4);
    iVar3 = (this->ay).last_time;
  }
  (this->ay).last_time = iVar3 - iVar4;
  iVar4 = *duration;
  iVar3 = (this->scc).last_time;
  if (iVar3 < iVar4) {
    Scc_Apu::run_until(&this->scc,iVar4);
    iVar3 = (this->scc).last_time;
  }
  (this->scc).last_time = iVar3 - iVar4;
  if (this->sn != (Sms_Apu *)0x0) {
    Sms_Apu::end_frame(this->sn,*duration);
  }
  return (blargg_err_t)0x0;
}

Assistant:

blargg_err_t Kss_Emu::run_clocks( blip_time_t& duration, int )
{
	while ( time() < duration )
	{
		blip_time_t end = min( duration, next_play );
		cpu::run( min( duration, next_play ) );
		if ( r.pc == idle_addr )
			set_time( end );
		
		if ( time() >= next_play )
		{
			next_play += play_period;
			if ( r.pc == idle_addr )
			{
				if ( !gain_updated )
				{
					gain_updated = true;
					if ( scc_accessed )
						update_gain();
				}
				
				ram [--r.sp] = idle_addr >> 8;
				ram [--r.sp] = idle_addr & 0xFF;
				r.pc = get_le16( header_.play_addr );
				GME_FRAME_HOOK( this );
			}
		}
	}
	
	duration = time();
	next_play -= duration;
	check( next_play >= 0 );
	adjust_time( -duration );
	ay.end_frame( duration );
	scc.end_frame( duration );
	if ( sn )
		sn->end_frame( duration );
	
	return 0;
}